

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocmap.h
# Opt level: O3

uint32_t __thiscall allocmap::findfree(allocmap *this,uint32_t size)

{
  _Rb_tree_color _Var1;
  int iVar2;
  iterator i;
  _Rb_tree_node_base *p_Var3;
  _Rb_tree_color ofs;
  
  p_Var3 = (this->_m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ofs = p_Var3[1]._M_color;
  while (((_Rb_tree_header *)p_Var3 != &(this->_m)._M_t._M_impl.super__Rb_tree_header &&
         (_Var1 = p_Var3[1]._M_color, _Var1 - ofs < size))) {
    iVar2 = *(int *)&p_Var3[1].field_0x4;
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    ofs = _Var1 + iVar2;
  }
  markused(this,ofs,size,"findfree");
  return ofs;
}

Assistant:

uint32_t findfree(uint32_t size)
    {
        uint32_t ofs= _m.begin()->first;
        for (auto i=_m.begin() ; i!=_m.end() ; ++i)
        {
            if (i->first-ofs >= size) {
                markused(ofs, size, "findfree");
                return ofs;
            }

            ofs= i->first + i->second;
        }
        // allocate new item at end
        markused(ofs, size, "findfree");
        return ofs;
    }